

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O0

void __thiscall
DIS::RecordSpecification::unmarshal(RecordSpecification *this,DataStream *dataStream)

{
  undefined1 local_38 [8];
  RecordSpecificationElement x;
  size_t idx;
  DataStream *dataStream_local;
  RecordSpecification *this_local;
  
  DataStream::operator>>(dataStream,&this->_numberOfRecordSets);
  std::vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>::
  clear(&this->_recordSets);
  x._recordLength = 0;
  x._recordCount = 0;
  x._recordValues = 0;
  x._pad4 = '\0';
  x._23_1_ = 0;
  for (; (ulong)x._16_8_ < (ulong)this->_numberOfRecordSets; x._16_8_ = x._16_8_ + 1) {
    RecordSpecificationElement::RecordSpecificationElement((RecordSpecificationElement *)local_38);
    RecordSpecificationElement::unmarshal((RecordSpecificationElement *)local_38,dataStream);
    std::vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>::
    push_back(&this->_recordSets,(value_type *)local_38);
    RecordSpecificationElement::~RecordSpecificationElement((RecordSpecificationElement *)local_38);
  }
  return;
}

Assistant:

void RecordSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfRecordSets;

     _recordSets.clear();
     for(size_t idx = 0; idx < _numberOfRecordSets; idx++)
     {
        RecordSpecificationElement x;
        x.unmarshal(dataStream);
        _recordSets.push_back(x);
     }
}